

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O3

void save_textures(vector<Image,_std::allocator<Image>_> *out_buf,int starting_index)

{
  ostream *poVar1;
  Image *pIVar2;
  string filename;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  string local_b0;
  string local_90;
  vector<Image,_std::allocator<Image>_> *local_70;
  void *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  string local_50;
  
  if (!preview_mode) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"saving images:",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_d0 = &local_c0;
    local_c8 = 0;
    local_c0 = '\0';
    pIVar2 = (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
             super__Vector_impl_data._M_start + starting_index;
    local_70 = out_buf;
    if (pIVar2 != (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,output_dir_abi_cxx11_._M_dataplus._M_p,
                   output_dir_abi_cxx11_._M_dataplus._M_p + output_dir_abi_cxx11_._M_string_length);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,out_filetype_abi_cxx11_._M_dataplus._M_p,
                   out_filetype_abi_cxx11_._M_dataplus._M_p +
                   out_filetype_abi_cxx11_._M_string_length);
        get_file_name(&local_50,&local_b0,starting_index,&local_90);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\tsaving image to filename ",0x1a);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_d0,local_c8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        local_68 = pIVar2->data;
        uStack_60._0_4_ = pIVar2->width;
        uStack_60._4_4_ = pIVar2->height;
        local_58._0_4_ = pIVar2->mipmaps;
        local_58._4_4_ = pIVar2->format;
        ExportImage(*pIVar2,local_d0);
        starting_index = starting_index + 1;
        pIVar2 = pIVar2 + 1;
      } while (pIVar2 != (local_70->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    }
  }
  return;
}

Assistant:

void save_textures(std::vector<Image> out_buf, int starting_index)
{
	if (!preview_mode) {
	std::cout << "saving images:" << std::endl;

	unsigned int log_index = starting_index;
	std::string filename;
	for (auto it = out_buf.begin()+starting_index; it != out_buf.end(); ++it) {
		filename = get_file_name(output_dir, log_index, out_filetype);
		std::cout << "\tsaving image to filename " << filename << std::endl;

		Image image = *it;
		ExportImage(image, filename.c_str());
		++log_index;
	}
	std::cout << std::endl;
	}
}